

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O0

void __thiscall
webrtc::NonlinearBeamformer::InitLowFrequencyCorrectionRanges(NonlinearBeamformer *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  FatalMessage local_328;
  string *local_1b0;
  string *_result_1;
  FatalMessage local_198;
  uint local_1c;
  string *local_18;
  string *_result;
  NonlinearBeamformer *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->sample_rate_hz_;
  _result = (string *)this;
  sVar3 = anon_unknown_9::Round((float)SUB164((ZEXT816(0) << 0x40 | ZEXT816(0xc800)) / auVar1,0));
  this->low_mean_start_bin_ = sVar3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->sample_rate_hz_;
  sVar3 = anon_unknown_9::Round((float)SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x19000)) / auVar2,0));
  this->low_mean_end_bin_ = sVar3;
  local_1c = 0;
  local_18 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                       (&this->low_mean_start_bin_,&local_1c,"low_mean_start_bin_ > 0U");
  if (local_18 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/nonlinear_beamformer.cc"
               ,0xf4,local_18);
    rtc::FatalMessage::stream(&local_198);
    rtc::FatalMessage::~FatalMessage(&local_198);
  }
  local_1b0 = rtc::CheckLTImpl<unsigned_long,unsigned_long>
                        (&this->low_mean_start_bin_,&this->low_mean_end_bin_,
                         "low_mean_start_bin_ < low_mean_end_bin_");
  if (local_1b0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_328,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/nonlinear_beamformer.cc"
               ,0xf5,local_1b0);
    rtc::FatalMessage::stream(&local_328);
    rtc::FatalMessage::~FatalMessage(&local_328);
  }
  return;
}

Assistant:

void NonlinearBeamformer::InitLowFrequencyCorrectionRanges() {
  low_mean_start_bin_ = Round(kLowMeanStartHz * kFftSize / sample_rate_hz_);
  low_mean_end_bin_ = Round(kLowMeanEndHz * kFftSize / sample_rate_hz_);

  RTC_DCHECK_GT(low_mean_start_bin_, 0U);
  RTC_DCHECK_LT(low_mean_start_bin_, low_mean_end_bin_);
}